

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall inja::FileError::FileError(FileError *this,string *message)

{
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *message_local;
  FileError *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"file_error",&local_39);
  InjaError::InjaError(&this->super_InjaError,&local_38,local_18);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  *(undefined ***)&this->super_InjaError = &PTR__FileError_0024d090;
  return;
}

Assistant:

explicit FileError(const std::string& message): InjaError("file_error", message) {}